

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_function_queue.h
# Opt level: O1

reentrant_put_transaction<typename_std::decay<Func>::type> * __thiscall
density::
conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
::
start_reentrant_push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func>
          (reentrant_put_transaction<typename_std::decay<Func>::type> *__return_storage_ptr__,
          void *this,Func_conflict *i_source)

{
  reentrant_put_transaction<Func> local_58;
  reentrant_put_transaction<Func> local_38;
  
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  start_reentrant_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_reentrant_put_samples(std::ostream&)::Func>
            (&local_38,
             (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
              *)this,i_source);
  local_58.m_queue = local_38.m_queue;
  local_58.m_put_transaction.m_queue = local_38.m_put_transaction.m_queue;
  local_58.m_put_transaction.m_put_data.m_control_block =
       local_38.m_put_transaction.m_put_data.m_control_block;
  local_58.m_put_transaction.m_put_data.m_user_storage =
       local_38.m_put_transaction.m_put_data.m_user_storage;
  local_38.m_queue =
       (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  local_38.m_put_transaction.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_38);
  __return_storage_ptr__->m_queue = local_58.m_queue;
  (__return_storage_ptr__->m_put_transaction).m_queue = local_58.m_put_transaction.m_queue;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_58.m_put_transaction.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_58.m_put_transaction.m_put_data.m_user_storage;
  local_58.m_queue =
       (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  local_58.m_put_transaction.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_58);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<typename std::decay<ELEMENT_TYPE>::type>
          start_reentrant_push(ELEMENT_TYPE && i_source)
        {
            return m_queue.start_reentrant_push(std::forward<ELEMENT_TYPE>(i_source));
        }